

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void codeAttach(Parse *pParse,int type,FuncDef *pFunc,Expr *pAuthArg,Expr *pFilename,Expr *pDbname,
               Expr *pKey)

{
  long lVar1;
  sqlite3 *db;
  int iVar2;
  Vdbe *p;
  char *zArg1;
  long in_FS_OFFSET;
  NameContext sName;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sName.pWinSelect = (Select *)&DAT_aaaaaaaaaaaaaaaa;
  sName._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sName._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sName.uNC.pEList = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
  sName.pNext = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
  sName.pParse = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  sName.pSrcList = (SrcList *)&DAT_aaaaaaaaaaaaaaaa;
  db = pParse->db;
  iVar2 = sqlite3ReadSchema(pParse);
  if ((iVar2 == 0) && (pParse->nErr == 0)) {
    sName.ncFlags = 0;
    sName.nNestedSelect = 0;
    sName.pWinSelect = (Select *)0x0;
    sName.pNext = (NameContext *)0x0;
    sName.nRef = 0;
    sName.nNcErr = 0;
    sName.pSrcList = (SrcList *)0x0;
    sName.uNC.pEList = (ExprList *)0x0;
    sName.pParse = pParse;
    iVar2 = resolveAttachExpr(&sName,pFilename);
    if (iVar2 == 0) {
      iVar2 = resolveAttachExpr(&sName,pDbname);
      if (iVar2 == 0) {
        iVar2 = resolveAttachExpr(&sName,pKey);
        if (iVar2 == 0) {
          if (pAuthArg != (Expr *)0x0) {
            if (pAuthArg->op == 'v') {
              zArg1 = (pAuthArg->u).zToken;
            }
            else {
              zArg1 = (char *)0x0;
            }
            iVar2 = sqlite3AuthCheck(pParse,type,zArg1,(char *)0x0,(char *)0x0);
            if (iVar2 != 0) goto LAB_001989be;
          }
          p = sqlite3GetVdbe(pParse);
          iVar2 = sqlite3GetTempRange(pParse,4);
          sqlite3ExprCode(pParse,pFilename,iVar2);
          sqlite3ExprCode(pParse,pDbname,iVar2 + 1);
          sqlite3ExprCode(pParse,pKey,iVar2 + 2);
          if (p != (Vdbe *)0x0) {
            sqlite3VdbeAddFunctionCall
                      (pParse,0,(iVar2 + 3) - (int)pFunc->nArg,iVar2 + 3,(int)pFunc->nArg,pFunc,0);
            sqlite3VdbeAddOp1(p,0xa6,(uint)(type == 0x18));
          }
        }
      }
    }
  }
LAB_001989be:
  sqlite3ExprDelete(db,pFilename);
  sqlite3ExprDelete(db,pDbname);
  sqlite3ExprDelete(db,pKey);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void codeAttach(
  Parse *pParse,       /* The parser context */
  int type,            /* Either SQLITE_ATTACH or SQLITE_DETACH */
  FuncDef const *pFunc,/* FuncDef wrapper for detachFunc() or attachFunc() */
  Expr *pAuthArg,      /* Expression to pass to authorization callback */
  Expr *pFilename,     /* Name of database file */
  Expr *pDbname,       /* Name of the database to use internally */
  Expr *pKey           /* Database key for encryption extension */
){
  int rc;
  NameContext sName;
  Vdbe *v;
  sqlite3* db = pParse->db;
  int regArgs;

  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ) goto attach_end;

  if( pParse->nErr ) goto attach_end;
  memset(&sName, 0, sizeof(NameContext));
  sName.pParse = pParse;

  if(
      SQLITE_OK!=resolveAttachExpr(&sName, pFilename) ||
      SQLITE_OK!=resolveAttachExpr(&sName, pDbname) ||
      SQLITE_OK!=resolveAttachExpr(&sName, pKey)
  ){
    goto attach_end;
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( ALWAYS(pAuthArg) ){
    char *zAuthArg;
    if( pAuthArg->op==TK_STRING ){
      assert( !ExprHasProperty(pAuthArg, EP_IntValue) );
      zAuthArg = pAuthArg->u.zToken;
    }else{
      zAuthArg = 0;
    }
    rc = sqlite3AuthCheck(pParse, type, zAuthArg, 0, 0);
    if(rc!=SQLITE_OK ){
      goto attach_end;
    }
  }
#endif /* SQLITE_OMIT_AUTHORIZATION */


  v = sqlite3GetVdbe(pParse);
  regArgs = sqlite3GetTempRange(pParse, 4);
  sqlite3ExprCode(pParse, pFilename, regArgs);
  sqlite3ExprCode(pParse, pDbname, regArgs+1);
  sqlite3ExprCode(pParse, pKey, regArgs+2);

  assert( v || db->mallocFailed );
  if( v ){
    sqlite3VdbeAddFunctionCall(pParse, 0, regArgs+3-pFunc->nArg, regArgs+3,
                               pFunc->nArg, pFunc, 0);
    /* Code an OP_Expire. For an ATTACH statement, set P1 to true (expire this
    ** statement only). For DETACH, set it to false (expire all existing
    ** statements).
    */
    sqlite3VdbeAddOp1(v, OP_Expire, (type==SQLITE_ATTACH));
  }

attach_end:
  sqlite3ExprDelete(db, pFilename);
  sqlite3ExprDelete(db, pDbname);
  sqlite3ExprDelete(db, pKey);
}